

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader14.cpp
# Opt level: O1

void __thiscall
COLLADASaxFWL::LibraryEffectsLoader14::begin__surface____fx_surface_common
          (LibraryEffectsLoader14 *this)

{
  surface____fx_surface_common__AttributeData *in_RSI;
  
  begin__surface____fx_surface_common
            ((LibraryEffectsLoader14 *)&this[-1].super_LibraryImagesLoader14.mLoader,in_RSI);
  return;
}

Assistant:

bool LibraryEffectsLoader14::begin__surface____fx_surface_common( const COLLADASaxFWL14::surface____fx_surface_common__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__surface____fx_surface_common(attributeData));
COLLADASaxFWL::surface____fx_surface_common__AttributeData attrData;
switch (attributeData.type) {
case COLLADASaxFWL14::ENUM__fx_surface_type_enum__UNTYPED: attrData.type=COLLADASaxFWL::ENUM__fx_surface_type__UNTYPED; break;
case COLLADASaxFWL14::ENUM__fx_surface_type_enum__1D: attrData.type=COLLADASaxFWL::ENUM__fx_surface_type__1D; break;
case COLLADASaxFWL14::ENUM__fx_surface_type_enum__2D: attrData.type=COLLADASaxFWL::ENUM__fx_surface_type__2D; break;
case COLLADASaxFWL14::ENUM__fx_surface_type_enum__3D: attrData.type=COLLADASaxFWL::ENUM__fx_surface_type__3D; break;
case COLLADASaxFWL14::ENUM__fx_surface_type_enum__RECT: attrData.type=COLLADASaxFWL::ENUM__fx_surface_type__RECT; break;
case COLLADASaxFWL14::ENUM__fx_surface_type_enum__CUBE: attrData.type=COLLADASaxFWL::ENUM__fx_surface_type__CUBE; break;
case COLLADASaxFWL14::ENUM__fx_surface_type_enum__DEPTH: attrData.type=COLLADASaxFWL::ENUM__fx_surface_type__DEPTH; break;
case COLLADASaxFWL14::ENUM__fx_surface_type_enum__COUNT: attrData.type=COLLADASaxFWL::ENUM__fx_surface_type__INVALID; break;
case COLLADASaxFWL14::ENUM__fx_surface_type_enum__NOT_PRESENT: attrData.type=COLLADASaxFWL::ENUM__fx_surface_type__NOT_PRESENT; break;
}
return mLoader->begin__surface____fx_surface_common(attrData);
}